

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::DrawElementsBaseVertexNegativeMappedBufferObjectsTest::iterate
          (DrawElementsBaseVertexNegativeMappedBufferObjectsTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  ostream *poVar6;
  TestError *pTVar7;
  uint uVar8;
  string local_358;
  undefined1 local_338 [384];
  stringstream error_sstream;
  ostream local_1a8;
  long lVar5;
  
  iVar2 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  uVar8 = 0;
  do {
    if (uVar8 == 4) {
      tcu::TestContext::setTestResult
                ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    uVar3 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->
              m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar8 < 2) && (uVar8 == 0 || (uVar3 & 0x300) == 0)) {
      DrawElementsBaseVertexTestBase::setUpNegativeTestObjects
                (&this->super_DrawElementsBaseVertexTestBase,false,uVar8 != 0);
      (**(code **)(lVar5 + 0xd00))
                (0x8892,0,(this->super_DrawElementsBaseVertexTestBase).
                          m_bo_negative_data_vertex_size,1);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glMapBufferRange() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                      ,0xd0c);
      (**(code **)(lVar5 + 0x570))
                (4,3,0x1405,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0)
      ;
      iVar2 = (**(code **)(lVar5 + 0x800))();
      if (iVar2 != 0x502) {
        std::__cxx11::stringstream::stringstream((stringstream *)&error_sstream);
        poVar6 = std::operator<<(&local_1a8,"Invalid error code generated by ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_338,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);
        std::operator<<(poVar6,(string *)local_338);
        std::__cxx11::string::~string((string *)local_338);
        local_338._0_8_ =
             ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_358,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);
        std::operator<<((ostream *)poVar1,(string *)&local_358);
        std::operator<<((ostream *)poVar1," returned error code [");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"] instead of GL_INVALID_OPERATION.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar7,(char *)local_338._0_8_,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xd22);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar5 + 0x590))
                (4,3,0x1405,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,1,
                 0);
      iVar2 = (**(code **)(lVar5 + 0x800))();
      if (iVar2 != 0x502) {
        std::__cxx11::stringstream::stringstream((stringstream *)&error_sstream);
        poVar6 = std::operator<<(&local_1a8,"Invalid error code generated by ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_338,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);
        std::operator<<(poVar6,(string *)local_338);
        std::__cxx11::string::~string((string *)local_338);
        local_338._0_8_ =
             ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_358,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);
        std::operator<<((ostream *)poVar1,(string *)&local_358);
        std::operator<<((ostream *)poVar1," returned error code [");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"] instead of GL_INVALID_OPERATION.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar7,(char *)local_338._0_8_,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xd36);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar5 + 0x5a8))
                (4,0,2,3,0x1405,
                 (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0);
      iVar2 = (**(code **)(lVar5 + 0x800))();
      if (iVar2 != 0x502) {
        std::__cxx11::stringstream::stringstream((stringstream *)&error_sstream);
        poVar6 = std::operator<<(&local_1a8,"Invalid error code generated by ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_338,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);
        std::operator<<(poVar6,(string *)local_338);
        std::__cxx11::string::~string((string *)local_338);
        local_338._0_8_ =
             ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_358,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);
        std::operator<<((ostream *)poVar1,(string *)&local_358);
        std::operator<<((ostream *)poVar1," returned error code [");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"] instead of GL_INVALID_OPERATION.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar7,(char *)local_338._0_8_,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xd49);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar5 + 0x1670))(0x8892);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glUnmapBuffer() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                      ,0xd4e);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult DrawElementsBaseVertexNegativeMappedBufferObjectsTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* The test needs to be run in four iterations, where for each iteration we configure the VAO
	 * in a slightly different manner.
	 */
	for (int iteration = 0; iteration < 4; ++iteration)
	{
		bool use_clientside_index_data  = ((iteration & (1 << 0)) != 0);
		bool use_clientside_vertex_data = ((iteration & (1 << 1)) != 0);

		/* OpenGL does not support client-side data. */
		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			if (use_clientside_index_data || use_clientside_vertex_data)
			{
				continue;
			}
		}

		/* Skip the iteration where no array buffer is used */
		if (use_clientside_vertex_data)
		{
			continue;
		}

		/* Set up the work environment */
		setUpNegativeTestObjects(use_clientside_vertex_data, use_clientside_index_data);

		/* Map the buffer object into process space */
		const glw::GLvoid* bo_ptr = gl.mapBufferRange(GL_ARRAY_BUFFER, 0, /* offset */
													  m_bo_negative_data_vertex_size, GL_MAP_READ_BIT);
		(void)bo_ptr;
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

		/* Perform draw calls that would otherwise have been valid, if it
		 * were not for the mapped VBO
		 */
		glw::GLenum error_code = GL_NONE;

		gl.drawElementsBaseVertex(GL_TRIANGLES, 3,								 /* count */
								  GL_UNSIGNED_INT, m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code generated by "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);

			m_testCtx.getLog() << tcu::TestLog::Message << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX)
							   << " returned error code [" << error_code << "] instead of GL_INVALID_OPERATION."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		} /* if (error_code != GL_INVALID_OPERATION) */

		gl.drawElementsInstancedBaseVertex(GL_TRIANGLES, 3,								 /* count */
										   GL_UNSIGNED_INT, m_draw_call_index_offset, 1, /* instancecount */
										   0);											 /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code generated by "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);

			m_testCtx.getLog() << tcu::TestLog::Message
							   << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX)
							   << " returned error code [" << error_code << "] instead of GL_INVALID_OPERATION."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		gl.drawRangeElementsBaseVertex(GL_TRIANGLES, 0, 2,							  /* end */
									   3,											  /* count */
									   GL_UNSIGNED_INT, m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code generated by "
						  << getFunctionName(FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);

			m_testCtx.getLog() << tcu::TestLog::Message << getFunctionName(FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX)
							   << " returned error code [" << error_code << "] instead of GL_INVALID_OPERATION."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		/* Unmap the BO before we proceed */
		gl.unmapBuffer(GL_ARRAY_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed");

	} /* for (all test iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}